

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_add(secp256k1_fe *r,secp256k1_fe *a)

{
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_verify(in_RSI);
  if (0x20 < in_RDI->magnitude + in_RSI->magnitude) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/field_impl.h"
            ,0x146,"test condition failed: r->magnitude + a->magnitude <= 32");
    abort();
  }
  secp256k1_fe_impl_add(in_RDI,in_RSI);
  in_RDI->magnitude = in_RSI->magnitude + in_RDI->magnitude;
  in_RDI->normalized = 0;
  secp256k1_fe_verify(in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(r->magnitude + a->magnitude <= 32);

    secp256k1_fe_impl_add(r, a);
    r->magnitude += a->magnitude;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}